

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
matchNextToken(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               *this)

{
  UTF8Reader *pUVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  bool bVar4;
  UnicodeChar UVar5;
  int iVar6;
  TokenType TVar7;
  char *pcVar8;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  UTF8Reader end;
  UTF8Reader temp;
  UTF8Reader temp_3;
  UTF8Reader local_98 [2];
  long local_88 [2];
  CompileMessage local_78;
  UTF8Reader *local_40;
  UTF8Reader local_38;
  
  pUVar1 = &this->input;
  UVar5 = UTF8Reader::operator*(pUVar1);
  if (((UVar5 & 0xffffffdf) - 0x41 < 0x1a) ||
     ((UVar5 - 0x24 < 0x3c && ((0x800000010000001U >> ((ulong)(UVar5 - 0x24) & 0x3f) & 1) != 0)))) {
    local_98[0].data = pUVar1->data;
    local_40 = pUVar1;
    UTF8Reader::operator++(local_98);
    UVar5 = UTF8Reader::operator*(local_98);
    if ((UVar5 - 0x30 < 10) || ((UVar5 == 0x5f || ((UVar5 & 0xffffffdf) - 0x41 < 0x1a)))) {
      uVar9 = 1;
      do {
        if (0xff < uVar9) {
          CompileMessageHelpers::createMessage<>(&local_78,syntax,error,"Identifier too long");
          (*this->_vptr_Tokeniser[2])(this,&local_78);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.location.sourceCode.object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.description._M_dataplus._M_p != &local_78.description.field_2) {
            operator_delete(local_78.description._M_dataplus._M_p,
                            local_78.description.field_2._M_allocated_capacity + 1);
          }
        }
        UTF8Reader::operator++(local_98);
        UVar5 = UTF8Reader::operator*(local_98);
        uVar9 = uVar9 + 1;
      } while (((UVar5 - 0x30 < 10) || (UVar5 == 0x5f)) || ((UVar5 & 0xffffffdf) - 0x41 < 0x1a));
    }
    pUVar1 = local_40;
    paVar2 = &local_78.description.field_2;
    local_78.description._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,local_40->data,local_98[0].data);
    std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.description._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.description._M_dataplus._M_p,
                      local_78.description.field_2._M_allocated_capacity + 1);
    }
    pUVar1->data = local_98[0].data;
    TVar7 = IdentifierMatcher::categoriseIdentifier(&this->currentStringValue);
    return (TokenType)TVar7.text;
  }
  if ((byte)(*pUVar1->data - 0x30U) < 10) {
    TVar7 = parseNumericLiteral(this,false);
    return (TokenType)TVar7.text;
  }
  if ((UVar5 == 0x2d) &&
     (local_78.description._M_dataplus._M_p = pUVar1->data,
     UTF8Reader::operator++((UTF8Reader *)&local_78),
     (byte)(*local_78.description._M_dataplus._M_p - 0x30U) < 10)) {
    UTF8Reader::operator++(pUVar1);
    TVar7 = parseNumericLiteral(this,true);
    if (((TVar7.text != "$integer32") &&
        ((TVar7.text == (char *)0x0 ||
         ((iVar6 = strcmp(TVar7.text,"$integer32"), TVar7.text != "$integer64" && (iVar6 != 0))))))
       && ((TVar7.text == (char *)0x0 || (iVar6 = strcmp(TVar7.text,"$integer64"), iVar6 != 0)))) {
      this->literalDoubleValue = -this->literalDoubleValue;
      return (TokenType)TVar7.text;
    }
    this->literalIntValue = -this->literalIntValue;
    return (TokenType)TVar7.text;
  }
  bVar4 = parseStringLiteral(this,UVar5);
  if (bVar4) {
    return (TokenType)"$string literal";
  }
  if (UVar5 == 0x2f) {
    if (this->shouldIgnoreComments == false) {
      local_78.description._M_dataplus._M_p = pUVar1->data;
      UTF8Reader::operator++((UTF8Reader *)&local_78);
      UVar5 = UTF8Reader::operator*((UTF8Reader *)&local_78);
      if (UVar5 == 0x2a) {
        local_78.description._M_dataplus._M_p = (this->input).data;
        (this->location).location.data = local_78.description._M_dataplus._M_p;
        uVar9 = 3;
        do {
          UTF8Reader::operator++((UTF8Reader *)&local_78);
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
        UTF8Reader::find(local_98,(char *)&local_78);
        if (*local_98[0].data == '\0') {
          CompileMessageHelpers::createMessage<>
                    (&local_78,syntax,error,"Unterminated \'/*\' comment");
          (*this->_vptr_Tokeniser[2])(this,&local_78);
          CompileMessage::~CompileMessage(&local_78);
        }
        uVar9 = 3;
        do {
          UTF8Reader::operator++(local_98);
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
        local_78.description._M_dataplus._M_p = (pointer)&local_78.description.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pUVar1->data,local_98[0].data);
      }
      else {
        if (UVar5 != 0x2f) goto LAB_001d136a;
        UTF8Reader::find(local_98,(char *)pUVar1);
        local_78.description._M_dataplus._M_p = (pointer)&local_78.description.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,(this->input).data,local_98[0].data);
      }
      std::__cxx11::string::operator=((string *)&this->currentStringValue,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.description._M_dataplus._M_p != &local_78.description.field_2) {
        operator_delete(local_78.description._M_dataplus._M_p,
                        local_78.description.field_2._M_allocated_capacity + 1);
      }
      pUVar1->data = local_98[0].data;
      return (TokenType)"$comment";
    }
  }
  else if ((UVar5 == 0x2e) && (bVar4 = parseFloatLiteral(this), bVar4)) {
    return (TokenType)(this->literalType).text;
  }
LAB_001d136a:
  pcVar8 = (char *)HEARTOperator::Matcher::match(pUVar1);
  if (pcVar8 == (char *)0x0) {
    pcVar3 = pUVar1->data;
    pcVar8 = "$eof";
    if (*pcVar3 != '\0') {
      local_38.data = pcVar3;
      UTF8Reader::operator++(&local_38);
      local_98[0].data = (char *)local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pcVar3,local_38.data);
      CompileMessageHelpers::createMessage<std::__cxx11::string>
                (&local_78,(CompileMessageHelpers *)0x1,none,0x2637c1,(char *)local_98,in_R9);
      (*this->_vptr_Tokeniser[2])(this,&local_78);
      CompileMessage::~CompileMessage(&local_78);
      if ((long *)local_98[0].data != local_88) {
        operator_delete(local_98[0].data,local_88[0] + 1);
      }
    }
  }
  return (TokenType)pcVar8;
}

Assistant:

TokenType matchNextToken()
    {
        if (IdentifierMatcher::isIdentifierStart (*input))
        {
            auto end = input;
            int len = 1;

            while (IdentifierMatcher::isIdentifierBody (*++end))
                if (++len > (int) maxIdentifierLength)
                    throwError (Errors::identifierTooLong());

            if (auto keyword = KeywordList::match (len, input))
            {
                input += len;
                return keyword;
            }

            currentStringValue = std::string (input.getAddress(), end.getAddress());
            input = end;
            return IdentifierMatcher::categoriseIdentifier (currentStringValue);
        }

        if (input.isDigit())
            return parseNumericLiteral (false);

        auto currentChar = *input;

        if (currentChar == '-' && (input + 1).isDigit())
        {
            ++input;
            auto tok = parseNumericLiteral (true);

            if (tok == Token::literalInt32 || tok == Token::literalInt64)
                literalIntValue = -literalIntValue;
            else
                literalDoubleValue = -literalDoubleValue;

            return tok;
        }

        if (parseStringLiteral (currentChar))
            return Token::literalString;

        if (currentChar == '.' && parseFloatLiteral())
            return literalType;

        if (currentChar == '/' && ! shouldIgnoreComments)
        {
            auto c2 = *(input + 1);

            if (c2 == '/')
            {
                auto end = input.find ("\n");
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }

            if (c2 == '*')
            {
                location.location = input;
                auto end = (input + 2).find ("*/");
                if (end.isEmpty()) throwError (Errors::unterminatedComment());
                end += 2;
                currentStringValue = std::string (input.getAddress(), end.getAddress());
                input = end;
                return Token::comment;
            }
        }

        if (auto op = OperatorList::match (input))
            return op;

        if (currentChar == '_' && IdentifierMatcher::isIdentifierBody (*(input + 1)))
            throwError (Errors::noLeadingUnderscoreAllowed());

        if (! input.isEmpty())
            throwError (Errors::illegalCharacter (std::string (input.getAddress(), (input + 1).getAddress())));

        return Token::eof;
    }